

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void writeTrailer(DescriptorWrapper *fd)

{
  char additionalNullTerminator;
  string trailerFilename;
  undefined1 local_61;
  long *local_60 [2];
  long local_50 [2];
  undefined2 local_3a;
  undefined8 local_38;
  undefined2 local_30;
  undefined8 local_2e;
  uint local_26;
  undefined2 local_22;
  
  local_3a = 0x71c7;
  local_30 = 0;
  local_38 = 0;
  local_2e = 1;
  local_26 = 0xb;
  local_22 = 0;
  DescriptorWrapper::writeFrom(fd,&local_3a,0x1a);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"TRAILER!!!","");
  local_61 = 0;
  DescriptorWrapper::writeFrom(fd,local_60[0],(ulong)(ushort)local_26);
  if ((local_26 & 1) != 0) {
    DescriptorWrapper::writeFrom(fd,&local_61,1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return;
}

Assistant:

void writeTrailer(DescriptorWrapper fd)
{
	header_old_cpio header;
	header.c_magic = 0x71c7;
	header.c_dev = 0;
	header.c_ino = 0;
	header.c_mode = 0;
	header.c_uid = 0;
	header.c_gid = 0;
	header.c_nlink = 1;
	header.c_rdev = 0;
	header.c_mtime[0] = 0;
	header.c_mtime[1] = 0;
	header.c_namesize = 11;
	header.c_filesize[0] = 0;
	header.c_filesize[1] = 0;

	fd.writeFrom(&header, sizeof(header_old_cpio));
	string trailerFilename("TRAILER!!!");
	char additionalNullTerminator = 0;
	fd.writeFrom((void*)trailerFilename.c_str(), header.c_namesize);
	if (header.c_namesize % 2 == 1)
		fd.writeFrom(&additionalNullTerminator, 1);
}